

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O2

void __thiscall timing_registry::dump(timing_registry *this)

{
  __node_base *p_Var1;
  vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> childrenToDelete;
  vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_> infos;
  task_info *local_60;
  vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> local_58;
  _Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_> local_38
  ;
  
  local_58.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::recursive_mutex::lock(&this->m);
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(this->tasks)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    if (p_Var1[0xf]._M_nxt == (_Hash_node_base *)0x0) {
      local_60 = (task_info *)(p_Var1 + 2);
      std::vector<timing_registry::task_info*,std::allocator<timing_registry::task_info*>>::
      emplace_back<timing_registry::task_info*>
                ((vector<timing_registry::task_info*,std::allocator<timing_registry::task_info*>> *)
                 &local_38,&local_60);
    }
  }
  print(this,(vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_> *)
             &local_38,0,&local_58);
  std::_Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>::
  ~_Vector_base(&local_38);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::clear(&local_58);
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::~vector(&local_58);
  return;
}

Assistant:

void dump()
    {
        std::vector<oqpi::task_handle> childrenToDelete;
        {
            std::lock_guard<std::recursive_mutex> __l(m);
            std::vector<task_info*> infos;
            for (auto &p : tasks)
            {
                if (p.second.parentUID == oqpi::invalid_task_uid)
                    infos.push_back(&p.second);
            }
            print(infos, 0, childrenToDelete);
        }
        childrenToDelete.clear();
    }